

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# numparse_symbols.h
# Opt level: O0

void __thiscall icu_63::numparse::impl::MinusSignMatcher::~MinusSignMatcher(MinusSignMatcher *this)

{
  void *in_RSI;
  MinusSignMatcher *this_local;
  
  ~MinusSignMatcher(this);
  UMemory::operator_delete((UMemory *)this,in_RSI);
  return;
}

Assistant:

class U_I18N_API MinusSignMatcher : public SymbolMatcher {
  public:
    MinusSignMatcher() = default;  // WARNING: Leaves the object in an unusable state

    MinusSignMatcher(const DecimalFormatSymbols& dfs, bool allowTrailing);

  protected:
    bool isDisabled(const ParsedNumber& result) const override;

    void accept(StringSegment& segment, ParsedNumber& result) const override;

  private:
    bool fAllowTrailing;
}